

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O1

void __thiscall
shaping_clipper::feed
          (shaping_clipper *this,float *in_samples,float *out_samples,bool diff_only,
          float *total_margin_shift)

{
  int iVar1;
  int iVar2;
  pointer pfVar3;
  pointer pfVar4;
  PFFFT_Setup *pPVar5;
  undefined7 in_register_00000009;
  long lVar6;
  ulong uVar7;
  float *mask_curve;
  shaping_clipper *psVar8;
  uint uVar9;
  float *pfVar10;
  float *pfVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  float *clipping_delta;
  float *pfVar15;
  float fVar16;
  float delta_boost;
  float fVar17;
  float fVar18;
  float afStack_b0 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_88;
  float *local_80;
  float *local_78;
  float *local_70;
  float *local_68;
  float local_5c;
  float local_58;
  undefined4 local_54;
  float diff_needed;
  PFFFT_Setup *local_48;
  uint local_3c;
  shaping_clipper *local_38;
  
  local_54 = (undefined4)CONCAT71(in_register_00000009,diff_only);
  iVar1 = this->size;
  iVar2 = this->overlap;
  lVar6 = (long)iVar2;
  if (iVar1 - iVar2 != 0 && iVar2 <= iVar1) {
    pfVar3 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      pfVar3[uVar14] = pfVar3[lVar6 + uVar14];
      pfVar4[uVar14] = pfVar4[lVar6 + uVar14];
      uVar14 = uVar14 + 1;
    } while ((uint)(iVar1 - iVar2) != uVar14);
  }
  if (0 < iVar2) {
    pfVar3 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (this->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      iVar13 = (iVar1 - iVar2) + (int)lVar12;
      pfVar3[iVar13] = in_samples[lVar12];
      pfVar4[iVar13] = 0.0;
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  uVar14 = (long)this->oversample * (long)iVar1 * 4 + 0xfU & 0xfffffffffffffff0;
  pfVar11 = (float *)(local_a8 + -uVar14);
  clipping_delta = (float *)((long)pfVar11 - uVar14);
  pfVar15 = (float *)((long)clipping_delta - uVar14);
  mask_curve = (float *)((long)pfVar15 - ((long)(iVar1 / 2) * 4 + 0x13U & 0xfffffffffffffff0));
  local_70 = total_margin_shift;
  local_38 = this;
  if (0 < iVar1) {
    pfVar3 = (this->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = this->max_oversample;
    pfVar10 = (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pfVar11[lVar6] = pfVar3[lVar6] * *pfVar10;
      lVar6 = lVar6 + 1;
      pfVar10 = pfVar10 + iVar2;
    } while (iVar1 != lVar6);
  }
  pPVar5 = this->pffft;
  _diff_needed = pfVar11;
  mask_curve[-2] = 1.496825e-39;
  mask_curve[-1] = 0.0;
  pffft_transform_ordered(pPVar5,pfVar11,pfVar15,(float *)0x0,PFFFT_FORWARD);
  psVar8 = local_38;
  mask_curve[-2] = 1.496846e-39;
  mask_curve[-1] = 0.0;
  calculate_mask_curve(psVar8,pfVar15,mask_curve);
  iVar1 = local_38->size;
  iVar2 = local_38->oversample;
  uVar9 = iVar2 * iVar1;
  iVar13 = local_38->max_oversample / iVar2;
  uVar14 = (ulong)uVar9;
  local_68 = pfVar15;
  local_3c = uVar9;
  local_78 = out_samples;
  if (iVar2 < 2) {
    local_48 = local_38->pffft;
    psVar8 = local_38;
    pfVar11 = _diff_needed;
  }
  else {
    local_48 = local_38->pffft_oversampled;
    pfVar15[iVar1] = pfVar15[1] * 0.5;
    pfVar15[1] = 0.0;
    lVar6 = (long)iVar1 + 1;
    if ((int)lVar6 < (int)uVar9) {
      mask_curve[-2] = 1.497023e-39;
      mask_curve[-1] = 0.0;
      memset(pfVar15 + lVar6,0,(ulong)((iVar2 + -1) * iVar1 - 2) * 4 + 4);
    }
    pPVar5 = local_48;
    pfVar11 = _diff_needed;
    mask_curve[-2] = 1.49706e-39;
    mask_curve[-1] = 0.0;
    pffft_transform_ordered(pPVar5,pfVar15,pfVar11,(float *)0x0,PFFFT_BACKWARD);
    psVar8 = local_38;
    uVar9 = local_3c;
    iVar1 = local_38->size;
    if (0 < (int)local_3c) {
      uVar7 = 0;
      do {
        pfVar11[uVar7] = pfVar11[uVar7] / (float)iVar1;
        uVar7 = uVar7 + 1;
      } while (uVar14 != uVar7);
    }
    if (-2 < iVar1) {
      iVar2 = local_38->oversample;
      uVar7 = 0;
      do {
        mask_curve[uVar7] = mask_curve[uVar7] * (float)iVar2;
        uVar7 = uVar7 + 1;
      } while (iVar1 / 2 + 1 != uVar7);
    }
  }
  if ((int)uVar9 < 1) {
    fVar17 = 0.0;
  }
  else {
    pfVar15 = (psVar8->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar7 = 0;
    fVar16 = 0.0;
    do {
      fVar17 = ABS(pfVar11[uVar7] * *pfVar15);
      if (ABS(pfVar11[uVar7] * *pfVar15) <= fVar16) {
        fVar17 = fVar16;
      }
      uVar7 = uVar7 + 1;
      pfVar15 = pfVar15 + iVar13;
      fVar16 = fVar17;
    } while (uVar14 != uVar7);
  }
  fVar17 = fVar17 / psVar8->clip_level;
  local_98 = ZEXT416((uint)fVar17);
  if (0 < (int)uVar9) {
    mask_curve[-2] = 1.497367e-39;
    mask_curve[-1] = 0.0;
    memset(clipping_delta,0,uVar14 * 4);
    psVar8 = local_38;
    fVar17 = (float)local_98._0_4_;
    uVar9 = local_3c;
  }
  if (local_70 != (float *)0x0) {
    *local_70 = 1.0;
  }
  fVar16 = psVar8->iterations;
  if (0.0 < fVar16) {
    local_5c = (float)(int)uVar9;
    local_58 = fVar17 + -1.0;
    local_80 = local_68 + 1;
    uVar7 = 0;
    fVar18 = 0.0;
    do {
      delta_boost = 2.0;
      local_a8 = ZEXT416((uint)fVar18);
      if (fVar18 < fVar16 / -3.0 + fVar16 || 2.0 <= fVar17) {
        delta_boost = 1.0;
      }
      local_88 = uVar7;
      mask_curve[-2] = 1.497614e-39;
      mask_curve[-1] = 0.0;
      clip_to_window(psVar8,pfVar11,clipping_delta,delta_boost);
      pPVar5 = local_48;
      pfVar11 = local_68;
      mask_curve[-2] = 1.497648e-39;
      mask_curve[-1] = 0.0;
      pffft_transform_ordered(pPVar5,clipping_delta,pfVar11,(float *)0x0,PFFFT_FORWARD);
      psVar8 = local_38;
      iVar1 = local_38->oversample;
      if (1 < iVar1) {
        pfVar11[1] = 0.0;
        iVar2 = psVar8->size;
        if (iVar2 + 1 < iVar2 * iVar1) {
          pfVar15 = local_80 + iVar2;
          mask_curve[-2] = 1.49774e-39;
          mask_curve[-1] = 0.0;
          memset(pfVar15,0,(ulong)((iVar1 + -1) * iVar2 - 2) * 4 + 4);
          psVar8 = local_38;
        }
      }
      mask_curve[-2] = 1.497761e-39;
      mask_curve[-1] = 0.0;
      limit_clip_spectrum(psVar8,pfVar11,mask_curve);
      pPVar5 = local_48;
      mask_curve[-2] = 1.497793e-39;
      mask_curve[-1] = 0.0;
      pffft_transform_ordered(pPVar5,pfVar11,clipping_delta,(float *)0x0,PFFFT_BACKWARD);
      uVar9 = local_3c;
      fVar17 = local_5c;
      if (0 < (int)local_3c) {
        uVar7 = 0;
        do {
          clipping_delta[uVar7] = clipping_delta[uVar7] / fVar17;
          uVar7 = uVar7 + 1;
        } while (uVar14 != uVar7);
      }
      psVar8 = local_38;
      pfVar11 = _diff_needed;
      if ((int)uVar9 < 1) {
        fVar17 = 0.0;
      }
      else {
        pfVar15 = (local_38->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start;
        fVar17 = 0.0;
        uVar7 = 0;
        do {
          fVar16 = ABS((_diff_needed[uVar7] + clipping_delta[uVar7]) * *pfVar15);
          if (fVar16 <= fVar17) {
            fVar16 = fVar17;
          }
          fVar17 = fVar16;
          uVar7 = uVar7 + 1;
          pfVar15 = pfVar15 + iVar13;
        } while (uVar14 != uVar7);
      }
      fVar17 = fVar17 / local_38->clip_level;
      fVar16 = 1.122;
      iVar1 = (int)local_88;
      if ((1.0 < (float)local_98._0_4_) && (fVar16 = 1.122, 1.0 < fVar17)) {
        fVar16 = fVar17;
        if ((0.0 < (float)local_98._0_4_ - fVar17) &&
           (((float)(iVar1 + 1) < local_38->iterations + local_38->iterations / -3.0 &&
            (fVar18 = local_58 / ((float)local_98._0_4_ - fVar17), fVar18 <= fVar17)))) {
          fVar16 = fVar18;
        }
        if (fVar16 <= 1.122) {
          fVar16 = 1.122;
        }
      }
      fVar16 = local_38->adaptive_distortion_strength * (fVar16 + -1.0) + 1.0;
      if (((local_70 != (float *)0x0) && (1.01 < fVar17)) &&
         ((float)local_a8._0_4_ < local_38->iterations + -1.0)) {
        *local_70 = *local_70 * fVar16;
      }
      iVar2 = local_38->size;
      if (-2 < iVar2) {
        uVar7 = 0;
        do {
          mask_curve[uVar7] = mask_curve[uVar7] * fVar16;
          uVar7 = uVar7 + 1;
        } while (iVar2 / 2 + 1 != uVar7);
      }
      uVar9 = iVar1 + 1;
      uVar7 = (ulong)uVar9;
      fVar18 = (float)(int)uVar9;
      fVar16 = psVar8->iterations;
    } while (fVar18 < fVar16);
  }
  iVar1 = psVar8->oversample;
  if ((1 < (long)iVar1) && (iVar2 = psVar8->size, 0 < (long)iVar2)) {
    lVar6 = 0;
    pfVar11 = clipping_delta;
    do {
      clipping_delta[lVar6] = *pfVar11;
      lVar6 = lVar6 + 1;
      pfVar11 = pfVar11 + iVar1;
    } while (iVar2 != lVar6);
  }
  pfVar11 = local_78;
  pfVar3 = (psVar8->out_dist_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = psVar8->size;
  if (0 < (long)iVar2) {
    iVar13 = psVar8->max_oversample;
    pfVar15 = (psVar8->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pfVar3[lVar6] = clipping_delta[lVar6] * *pfVar15 + pfVar3[lVar6];
      lVar6 = lVar6 + 1;
      pfVar15 = pfVar15 + iVar13;
    } while (iVar2 != lVar6);
  }
  iVar2 = psVar8->overlap;
  lVar6 = (long)iVar2;
  if (0 < lVar6) {
    lVar12 = 0;
    do {
      local_78[lVar12] = pfVar3[lVar12] / 1.5;
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  if (1 < iVar1) {
    if (iVar2 < 1) {
      fVar17 = 0.0;
    }
    else {
      fVar17 = 0.0;
      lVar12 = 0;
      do {
        fVar16 = ABS(local_78[lVar12]);
        if (ABS(local_78[lVar12]) <= fVar17) {
          fVar16 = fVar17;
        }
        fVar17 = fVar16;
        lVar12 = lVar12 + 1;
      } while (lVar6 != lVar12);
    }
    if (0 < iVar2 && fVar17 < psVar8->clip_level * 0.001) {
      mask_curve[-2] = 1.498735e-39;
      mask_curve[-1] = 0.0;
      memset(pfVar11,0,lVar6 * 4);
      psVar8 = local_38;
    }
  }
  if (0 < iVar2 && (char)local_54 == '\0') {
    pfVar3 = (psVar8->in_frame).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    do {
      pfVar11[lVar12] = pfVar3[lVar12] + pfVar11[lVar12];
      lVar12 = lVar12 + 1;
    } while (lVar6 != lVar12);
  }
  return;
}

Assistant:

void shaping_clipper::feed(const float* in_samples, float* out_samples, bool diff_only, float* total_margin_shift) {
    // shift in/out buffers
    for (int i = 0; i < this->size - this->overlap; i++) {
        this->in_frame[i] = this->in_frame[i + this->overlap];
        this->out_dist_frame[i] = this->out_dist_frame[i + this->overlap];
    }
    for (int i = 0; i < this->overlap; i++) {
        this->in_frame[i + this->size - this->overlap] = in_samples[i];
        this->out_dist_frame[i + this->size - this->overlap] = 0;
    }

    float peak;
    float* windowed_frame = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* clipping_delta = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* spectrum_buf = (float*)alloca(sizeof(float) * this->size * this->oversample);
    float* mask_curve = (float*)alloca(sizeof(float) * (this->size / 2 + 1));

    apply_window(this->in_frame.data(), windowed_frame);
    pffft_transform_ordered(this->pffft, windowed_frame, spectrum_buf, NULL, PFFFT_FORWARD);
    calculate_mask_curve(spectrum_buf, mask_curve);

    int clipping_samples = this->size * this->oversample;
    int window_stride = this->max_oversample / this->oversample;
    PFFFT_Setup* clipping_pffft = this->pffft;
    if (this->oversample > 1) {
        clipping_pffft = this->pffft_oversampled;

        // use IFFT to oversample the windowed frame
        spectrum_buf[this->size] = spectrum_buf[1] / 2;
        spectrum_buf[1] = 0;
        for (int i = this->size + 1; i < this->size * this->oversample; i++) {
            spectrum_buf[i] = 0;
        }
        pffft_transform_ordered(this->pffft_oversampled, spectrum_buf, windowed_frame, NULL, PFFFT_BACKWARD);
        float fft_ifft_scale = this->size;
        for (int i = 0; i < clipping_samples; i++) {
            windowed_frame[i] /= fft_ifft_scale;
        }

        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= this->oversample;
        }
    }

    float orig_peak = 0;
    for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
        orig_peak = std::max<float>(orig_peak, std::abs(windowed_frame[sample_idx] * inv_window[window_idx]));
    }
    orig_peak /= this->clip_level;
    peak = orig_peak;

    // clear clipping_delta
    for (int i = 0; i < clipping_samples; i++) {
        clipping_delta[i] = 0;
    }

    if (total_margin_shift) {
        *total_margin_shift = 1.0;
    }

    // repeat clipping-filtering process a few times to control both the peaks and the spectrum
    for (int i = 0; i < this->iterations; i++) {
        // The last 1/3 of rounds have boosted delta to help reach the peak target faster
        float delta_boost = 1.0;
        if (i >= this->iterations - this->iterations / 3) {
            // boosting the delta when largs peaks are still present is dangerous
            if (peak < 2.0) {
                delta_boost = 2.0;
            }
        }
        clip_to_window(windowed_frame, clipping_delta, delta_boost);

        pffft_transform_ordered(clipping_pffft, clipping_delta, spectrum_buf, NULL, PFFFT_FORWARD);

        if (this->oversample > 1) {
            // Zero out all frequency bins above the base nyquist rate.
            // limit_clip_spectrum doesn't handle these bins.
            spectrum_buf[1] = 0;
            for (int i = this->size + 1; i < this->size * this->oversample; i++) {
                spectrum_buf[i] = 0;
            }
        }

        limit_clip_spectrum(spectrum_buf, mask_curve);

        pffft_transform_ordered(clipping_pffft, spectrum_buf, clipping_delta, NULL, PFFFT_BACKWARD);
        // see pffft.h
        for (int i = 0; i < clipping_samples; i++) {
            clipping_delta[i] /= clipping_samples;
        }

        peak = 0;
        for (int sample_idx = 0, window_idx = 0; sample_idx < clipping_samples; sample_idx++, window_idx += window_stride) {
            peak = std::max<float>(peak, std::abs((windowed_frame[sample_idx] + clipping_delta[sample_idx]) * inv_window[window_idx]));
        }
        peak /= this->clip_level;

        // Automatically adjust mask_curve as necessary to reach peak target
        float mask_curve_shift = 1.122; // 1.122 is 1dB
        if (orig_peak > 1.0 && peak > 1.0) {
            float diff_achieved = orig_peak - peak;
            if (i + 1 < this->iterations - this->iterations / 3 && diff_achieved > 0) {
                float diff_needed = orig_peak - 1.0;
                float diff_ratio = diff_needed / diff_achieved;
                // If a good amount of peak reduction was already achieved,
                // don't shift the mask_curve by the full peak value
                // On the other hand, if only a little peak reduction was achieved,
                // don't shift the mask_curve by the enormous diff_ratio.
                diff_ratio = std::min<float>(diff_ratio, peak);
                mask_curve_shift = std::max<float>(mask_curve_shift, diff_ratio);
            } else {
                // If the peak got higher than the input or we are in the last 1/3 rounds,
                // go back to the heavy-handed peak heuristic.
                mask_curve_shift = std::max<float>(mask_curve_shift, peak);
            }
        }

        mask_curve_shift = 1.0 + (mask_curve_shift - 1.0) * this->adaptive_distortion_strength;

        if (total_margin_shift && peak > 1.01 && i < this->iterations - 1) {
            *total_margin_shift *= mask_curve_shift;
        }

        // Be less strict in the next iteration.
        // This helps with peak control.
        for (int i = 0; i < this->size / 2 + 1; i++) {
            mask_curve[i] *= mask_curve_shift;
        }
    }

    if (this->oversample > 1) {
        // Downsample back to original rate.
        // We already zeroed out all frequency bins above the base nyquist rate so we can simply drop samples here.
        for (int i = 0; i < this->size; i++) {
            clipping_delta[i] = clipping_delta[i * this->oversample];
        }
    }

    // do overlap & add
    apply_window(clipping_delta, this->out_dist_frame.data(), true);

    for (int i = 0; i < this->overlap; i++) {
        // 4 times overlap with squared hanning window results in 1.5 time increase in amplitude
        out_samples[i] = this->out_dist_frame[i] / 1.5;
    }

    if (this->oversample > 1) {
        // When oversampling is active, the clipping delta can be non-zero even if all the samples in the frame are well below the threshold.
        // This is likely due to the aliasing introduced when windowing near-nyquist frequencies.
        // For purity, detect and remove these unwanted changes to the input signal.
        // The effect on peak control is < 0.1% or -60dB. Oversampling is not exact anyway.
        float max_out_diff = 0;
        for (int i = 0; i < this->overlap; i++) {
            max_out_diff = std::max(max_out_diff, std::abs(out_samples[i]));
        }
        if (max_out_diff < this->clip_level * 0.001) {
            for (int i = 0; i < this->overlap; i++) {
                out_samples[i] = 0;
            }
        }
    }

    if (!diff_only) {
        for (int i = 0; i < this->overlap; i++) {
            out_samples[i] += this->in_frame[i];
        }
    }
}